

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O0

bool ApprovalTests::CIBuildOnlyReporter::isRunningUnderCI(void)

{
  byte bVar1;
  const_iterator ppcVar2;
  char **variable;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  initializer_list<const_char_*> environmentVariablesForCI;
  initializer_list<const_char_*> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  const_iterator local_60;
  char *local_50 [7];
  initializer_list<const_char_*> local_18;
  
  memcpy(local_50,&PTR_anon_var_dwarf_1bf26f_0028c940,0x38);
  local_18._M_array = local_50;
  local_18._M_len = 7;
  local_60 = ::std::initializer_list<const_char_*>::begin(&local_18);
  ppcVar2 = ::std::initializer_list<const_char_*>::end(in_stack_ffffffffffffff70);
  while( true ) {
    if (local_60 == ppcVar2) {
      return false;
    }
    SystemUtils::safeGetEnv_abi_cxx11_(in_stack_ffffffffffffff78);
    bVar1 = ::std::__cxx11::string::empty();
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    if (((bVar1 ^ 0xff) & 1) != 0) break;
    local_60 = local_60 + 1;
  }
  return true;
}

Assistant:

bool CIBuildOnlyReporter::isRunningUnderCI()
    {
        /*
        auto AppVeyor = {"CI", "APPVEYOR"}; // https://www.appveyor.com/docs/environment-variables/
        auto AzurePipelines = {"TF_BUILD"}; // https://docs.microsoft.com/en-us/azure/devops/pipelines/build/variables?view=azure-devops&viewFallbackFrom=vsts&tabs=yaml
        auto GitHubActions = {"GITHUB_ACTIONS"}; // https://help.github.com/en/actions/configuring-and-managing-workflows/using-environment-variables
        auto GoCD = {"GO_SERVER_URL"}: // https://docs.gocd.org/current/faq/dev_use_current_revision_in_build.html
        auto Jenkins = {"JENKINS_URL"}: // https://wiki.jenkins.io/display/JENKINS/Building+a+software+project
        auto TeamCity = {"TEAMCITY_VERSION"}; // https://confluence.jetbrains.com/display/TCD18/Predefined+Build+Parameters
        auto Travis = {"CI", "TRAVIS", "CONTINUOUS_INTEGRATION"}; // https://docs.travis-ci.com/user/environment-variables/#default-environment-variables
        auto environmentVariablesForCI = combine({
            // begin-snippet: supported_ci_systems
            AppVeyor,
            AzurePipelines,
            GitHubActions,
            GoCD
            Jenkins,
            TeamCity,
            Travis,
            // end-snippet
        });
         */
        auto environmentVariablesForCI = {
            // begin-snippet: supported_ci_env_vars
            "CI",
            "CONTINUOUS_INTEGRATION",
            "GITHUB_ACTIONS",
            "GO_SERVER_URL",
            "JENKINS_URL",
            "TEAMCITY_VERSION",
            "TF_BUILD"
            // end-snippet
        };
        for (const auto& variable : environmentVariablesForCI)
        {
            if (!SystemUtils::safeGetEnv(variable).empty())
            {
                return true;
            }
        }
        return false;
    }